

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context_strand.hpp
# Opt level: O0

return_type __thiscall
asio::io_context::strand::
dispatch<asio::detail::rewrapped_handler<asio::detail::wrapped_handler<asio::io_context::strand,std::function<void()>,asio::detail::is_continuation_if_running>,std::function<void()>>>
          (strand *this,
          rewrapped_handler<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>,_std::function<void_()>_>
          *handler)

{
  rewrapped_handler<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>,_std::function<void_()>_>
  *in_RDI;
  async_completion<asio::detail::rewrapped_handler<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>,_std::function<void_()>_>,_void_()>
  init;
  rewrapped_handler<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>,_std::function<void_()>_>
  *in_stack_00000080;
  implementation_type *in_stack_00000088;
  strand_service *in_stack_00000090;
  async_completion<asio::detail::rewrapped_handler<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>,_std::function<void_()>_>,_void_()>
  *in_stack_ffffffffffffffe0;
  
  async_completion<asio::detail::rewrapped_handler<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>,_std::function<void_()>_>,_void_()>
  ::async_completion(in_stack_ffffffffffffffe0,in_RDI);
  detail::strand_service::
  dispatch<asio::detail::rewrapped_handler<asio::detail::wrapped_handler<asio::io_context::strand,std::function<void()>,asio::detail::is_continuation_if_running>,std::function<void()>>>
            (in_stack_00000090,in_stack_00000088,in_stack_00000080);
  async_result<asio::detail::rewrapped_handler<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>,_std::function<void_()>_>,_void_()>
  ::get((async_result<asio::detail::rewrapped_handler<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>,_std::function<void_()>_>,_void_()>
         *)0x2cf589);
  return;
}

Assistant:

dispatch(ASIO_MOVE_ARG(LegacyCompletionHandler) handler)
  {
    // If you get an error on the following line it means that your handler does
    // not meet the documented type requirements for a LegacyCompletionHandler.
    ASIO_LEGACY_COMPLETION_HANDLER_CHECK(
        LegacyCompletionHandler, handler) type_check;

    async_completion<LegacyCompletionHandler, void ()> init(handler);

    service_.dispatch(impl_, init.completion_handler);

    return init.result.get();
  }